

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O0

void pre_process_data(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                     JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr,
                     JDIMENSION out_row_groups_avail)

{
  jpeg_c_prep_controller *pjVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  uint local_60;
  jpeg_component_info *local_58;
  jpeg_component_info *compptr;
  int local_48;
  JDIMENSION inrows;
  int ci;
  int numrows;
  my_prep_ptr prep;
  JDIMENSION *out_row_group_ctr_local;
  JSAMPIMAGE output_buf_local;
  JDIMENSION in_rows_avail_local;
  JDIMENSION *in_row_ctr_local;
  JSAMPARRAY input_buf_local;
  j_compress_ptr cinfo_local;
  
  pjVar1 = cinfo->prep;
  do {
    bVar4 = false;
    if (*in_row_ctr < in_rows_avail) {
      bVar4 = *out_row_group_ctr < out_row_groups_avail;
    }
    if (!bVar4) {
      return;
    }
    local_60 = in_rows_avail - *in_row_ctr;
    uVar2 = cinfo->max_v_samp_factor - *(int *)((long)&pjVar1[6].start_pass + 4);
    if (uVar2 < local_60) {
      local_60 = uVar2;
    }
    (*cinfo->cconvert->color_convert)
              (cinfo,input_buf + *in_row_ctr,(JSAMPIMAGE)(pjVar1 + 1),
               *(JDIMENSION *)((long)&pjVar1[6].start_pass + 4),local_60);
    *in_row_ctr = local_60 + *in_row_ctr;
    *(uint *)((long)&pjVar1[6].start_pass + 4) =
         local_60 + *(int *)((long)&pjVar1[6].start_pass + 4);
    *(uint *)&pjVar1[6].start_pass = *(int *)&pjVar1[6].start_pass - local_60;
    if ((*(int *)&pjVar1[6].start_pass == 0) &&
       (*(int *)((long)&pjVar1[6].start_pass + 4) < cinfo->max_v_samp_factor)) {
      for (local_48 = 0; local_48 < cinfo->num_components; local_48 = local_48 + 1) {
        expand_bottom_edge((JSAMPARRAY)(&pjVar1[1].start_pass)[local_48],cinfo->image_width,
                           *(int *)((long)&pjVar1[6].start_pass + 4),cinfo->max_v_samp_factor);
      }
      *(int *)((long)&pjVar1[6].start_pass + 4) = cinfo->max_v_samp_factor;
    }
    if (*(int *)((long)&pjVar1[6].start_pass + 4) == cinfo->max_v_samp_factor) {
      (*cinfo->downsample->downsample)
                (cinfo,(JSAMPIMAGE)(pjVar1 + 1),0,output_buf,*out_row_group_ctr);
      *(undefined4 *)((long)&pjVar1[6].start_pass + 4) = 0;
      *out_row_group_ctr = *out_row_group_ctr + 1;
    }
  } while ((*(int *)&pjVar1[6].start_pass != 0) || (out_row_groups_avail <= *out_row_group_ctr));
  local_48 = 0;
  local_58 = cinfo->comp_info;
  for (; local_48 < cinfo->num_components; local_48 = local_48 + 1) {
    iVar3 = (local_58->v_samp_factor * local_58->DCT_v_scaled_size) / cinfo->min_DCT_v_scaled_size;
    expand_bottom_edge(output_buf[local_48],local_58->width_in_blocks * local_58->DCT_h_scaled_size,
                       *out_row_group_ctr * iVar3,out_row_groups_avail * iVar3);
    local_58 = local_58 + 1;
  }
  *out_row_group_ctr = out_row_groups_avail;
  return;
}

Assistant:

METHODDEF(void)
pre_process_data (j_compress_ptr cinfo,
		  JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
		  JDIMENSION in_rows_avail,
		  JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
		  JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr) cinfo->prep;
  int numrows, ci;
  JDIMENSION inrows;
  jpeg_component_info * compptr;

  while (*in_row_ctr < in_rows_avail &&
	 *out_row_group_ctr < out_row_groups_avail) {
    /* Do color conversion to fill the conversion buffer. */
    inrows = in_rows_avail - *in_row_ctr;
    numrows = cinfo->max_v_samp_factor - prep->next_buf_row;
    numrows = (int) MIN((JDIMENSION) numrows, inrows);
    (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
				       prep->color_buf,
				       (JDIMENSION) prep->next_buf_row,
				       numrows);
    *in_row_ctr += numrows;
    prep->next_buf_row += numrows;
    prep->rows_to_go -= numrows;
    /* If at bottom of image, pad to fill the conversion buffer. */
    if (prep->rows_to_go == 0 &&
	prep->next_buf_row < cinfo->max_v_samp_factor) {
      for (ci = 0; ci < cinfo->num_components; ci++) {
	expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
			   prep->next_buf_row, cinfo->max_v_samp_factor);
      }
      prep->next_buf_row = cinfo->max_v_samp_factor;
    }
    /* If we've filled the conversion buffer, empty it. */
    if (prep->next_buf_row == cinfo->max_v_samp_factor) {
      (*cinfo->downsample->downsample) (cinfo,
					prep->color_buf, (JDIMENSION) 0,
					output_buf, *out_row_group_ctr);
      prep->next_buf_row = 0;
      (*out_row_group_ctr)++;
    }
    /* If at bottom of image, pad the output to a full iMCU height.
     * Note we assume the caller is providing a one-iMCU-height output buffer!
     */
    if (prep->rows_to_go == 0 &&
	*out_row_group_ctr < out_row_groups_avail) {
      for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	   ci++, compptr++) {
	numrows = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
		  cinfo->min_DCT_v_scaled_size;
	expand_bottom_edge(output_buf[ci],
			   compptr->width_in_blocks * compptr->DCT_h_scaled_size,
			   (int) (*out_row_group_ctr * numrows),
			   (int) (out_row_groups_avail * numrows));
      }
      *out_row_group_ctr = out_row_groups_avail;
      break;			/* can exit outer loop without test */
    }
  }
}